

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  Flags FVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  MatcherDescriberInterface *pMVar4;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  pointer *__ptr;
  char *pcVar8;
  long lVar9;
  undefined1 local_58 [16];
  pointer local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  FVar1 = this->match_flags_;
  if (FVar1 == Superset) {
    pcVar8 = "a surjection from elements to requirements exists such that:\n";
  }
  else {
    if (FVar1 != Subset) {
      if (FVar1 == ExactMatch) {
        ppMVar2 = (this->matcher_describers_).
                  super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppMVar3 = (this->matcher_describers_).
                  super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar2 == ppMVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"is empty",8);
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"has ",4);
        if ((long)ppMVar3 - (long)ppMVar2 == 8) {
          Elements((UnorderedElementsAreMatcherImplBase *)local_58,1);
          Message::GetString_abi_cxx11_((string *)(local_58 + 8),(Message *)local_58);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(char *)local_58._8_8_,(long)local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._8_8_ != &local_40) {
            operator_delete((void *)local_58._8_8_,local_40._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," and that element ",0x12);
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_58._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_58._0_8_ + 8))();
          }
          pMVar4 = *(this->matcher_describers_).
                    super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (*pMVar4->_vptr_MatcherDescriberInterface[2])(pMVar4,os);
          return;
        }
        Elements((UnorderedElementsAreMatcherImplBase *)local_58,
                 (long)(this->matcher_describers_).
                       super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->matcher_describers_).
                       super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        Message::GetString_abi_cxx11_((string *)(local_58 + 8),(Message *)local_58);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(char *)local_58._8_8_,(long)local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._8_8_ != &local_40) {
          operator_delete((void *)local_58._8_8_,local_40._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," and there exists some permutation of elements such that:\n",0x3a);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_58._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_58._0_8_ + 8))();
        }
      }
      goto LAB_00174dbb;
    }
    pcVar8 = "an injection from elements to requirements exists such that:\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,0x3d);
LAB_00174dbb:
  if ((this->matcher_describers_).
      super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->matcher_describers_).
      super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar8 = "";
    lVar9 = 0;
    do {
      sVar6 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,sVar6);
      if (this->match_flags_ == ExactMatch) {
        std::__ostream_insert<char,std::char_traits<char>>(os," - element #",0xc);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        lVar7 = 1;
        pcVar8 = " ";
      }
      else {
        lVar7 = 0xe;
        pcVar8 = " - an element ";
        poVar5 = os;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
      pMVar4 = (this->matcher_describers_).
               super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9];
      (*pMVar4->_vptr_MatcherDescriberInterface[2])(pMVar4,os);
      pcVar8 = "\n";
      if (this->match_flags_ == ExactMatch) {
        pcVar8 = ", and\n";
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != (long)(this->matcher_describers_).
                            super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->matcher_describers_).
                            super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "is empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "has " << Elements(1) << " and that element ";
        matcher_describers_[0]->DescribeTo(os);
        return;
      }
      *os << "has " << Elements(matcher_describers_.size())
          << " and there exists some permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "a surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "an injection from elements to requirements exists such that:\n";
      break;
  }

  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}